

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_derive.c
# Opt level: O1

int test_derive_alg(char *algo,char *param,int mode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  EVP_PKEY *pkey;
  EVP_PKEY *pkey_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t *keylen;
  char *pcVar4;
  size_t skeyA_len;
  size_t skeyB_len;
  size_t local_40;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  switch(mode) {
  case 0:
    pcVar4 = "VKO256";
    keylen = (size_t *)0x3d6;
    break;
  case 1:
    pcVar4 = "VKO512";
    keylen = (size_t *)0x3d7;
    break;
  case 2:
    pcVar4 = "VKO";
    keylen = (size_t *)0x0;
    break;
  case 3:
    iVar1 = strcmp(algo,"gost2001");
    keylen = (size_t *)0x0;
    if (iVar1 == 0) {
      return 0;
    }
    pcVar4 = "KEG";
    break;
  default:
    abort();
  }
  printf("\x1b[1;34mTest %s for %s %s\x1b[m - ",pcVar4,algo,param);
  iVar1 = keygen((EVP_PKEY_CTX *)algo,(EVP_PKEY *)param);
  pkey = (EVP_PKEY *)CONCAT44(extraout_var,iVar1);
  iVar1 = keygen((EVP_PKEY_CTX *)algo,(EVP_PKEY *)param);
  pkey_00 = (EVP_PKEY *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = derive((EVP_PKEY_CTX *)pkey,(uchar *)pkey_00,keylen);
  iVar2 = derive((EVP_PKEY_CTX *)pkey_00,(uchar *)pkey,keylen);
  iVar3 = memcmp((void *)CONCAT44(extraout_var_01,iVar1),(void *)CONCAT44(extraout_var_02,iVar2),
                 local_40);
  pcVar4 = "\x1b[1;31mKEK mismatch\x1b[m";
  if (iVar3 == 0) {
    pcVar4 = "\x1b[1;32mKEK match\x1b[m";
  }
  puts(pcVar4);
  EVP_PKEY_free(pkey);
  EVP_PKEY_free(pkey_00);
  CRYPTO_free((void *)CONCAT44(extraout_var_01,iVar1));
  CRYPTO_free((void *)CONCAT44(extraout_var_02,iVar2));
  return iVar3;
}

Assistant:

int test_derive_alg(const char *algo, const char *param, int mode)
{
    int ret = 0;

    char *name = NULL;
    int dgst_nid = 0;
    int ukm_len = 0;
    switch (mode) {
    case 0:
        dgst_nid = NID_id_GostR3411_2012_256;
        name = "VKO256";
        ukm_len = 1;
        break;
    case 1:
        dgst_nid = NID_id_GostR3411_2012_512;
        name = "VKO512";
        ukm_len = 1;
        break;
    case 2:
        name = "VKO";
        ukm_len = 8;
        break;
    case 3:
        if (!strcmp(algo, "gost2001"))
            return 0; /* Skip. */
        name = "KEG";
        ukm_len = 32;
        break;
#define NR_MODES 4
    default:
        abort();
    }
    printf(cBLUE "Test %s for %s %s" cNORM " - ", name, algo, param);

    EVP_PKEY *keyA = keygen(algo, param);
    EVP_PKEY *keyB = keygen(algo, param);

    size_t skeyA_len, skeyB_len;
    unsigned char *skeyA = derive(keyA, keyB, dgst_nid, ukm_len, &skeyA_len);
    unsigned char *skeyB = derive(keyB, keyA, dgst_nid, ukm_len, &skeyB_len);

    ret = memcmp(skeyA, skeyB, skeyA_len);
    if (!ret)
        printf(cGREEN "KEK match" cNORM "\n");
    else
        printf(cRED "KEK mismatch" cNORM "\n");

    EVP_PKEY_free(keyA);
    EVP_PKEY_free(keyB);
    OPENSSL_free(skeyA);
    OPENSSL_free(skeyB);
    return ret;
}